

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_run_container_iandnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  rle16_t rVar1;
  bool bVar2;
  int iVar3;
  array_container_t *paVar4;
  int local_2c;
  rle16_t rle;
  int32_t rlepos;
  container_t **dst_local;
  run_container_t *src_2_local;
  bitset_container_t *src_1_local;
  
  *dst = src_1;
  for (local_2c = 0; local_2c < src_2->n_runs; local_2c = local_2c + 1) {
    rVar1 = src_2->runs[local_2c];
    bitset_reset_range(src_1->words,(uint)rVar1 & 0xffff,
                       ((uint)rVar1 & 0xffff) + ((uint)rVar1 >> 0x10) + 1);
  }
  iVar3 = bitset_container_compute_cardinality(src_1);
  src_1->cardinality = iVar3;
  bVar2 = 0x1000 < src_1->cardinality;
  if (!bVar2) {
    paVar4 = array_container_from_bitset(src_1);
    *dst = paVar4;
    bitset_container_free(src_1);
  }
  return bVar2;
}

Assistant:

bool bitset_run_container_iandnot(
    bitset_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    *dst = src_1;

    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(src_1->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    src_1->cardinality = bitset_container_compute_cardinality(src_1);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}